

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O0

void __thiscall
arma::Mat<int>::Mat(Mat<int> *this,arma_vec_indicator *param_2,uword in_n_rows,uword in_n_cols,
                   uhword in_vec_state)

{
  int in_ECX;
  int in_EDX;
  int *in_RDI;
  undefined2 in_R8W;
  
  *in_RDI = in_EDX;
  in_RDI[1] = in_ECX;
  in_RDI[2] = in_EDX * in_ECX;
  in_RDI[3] = 0;
  *(undefined2 *)(in_RDI + 4) = in_R8W;
  *(undefined2 *)((long)in_RDI + 0x12) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  init_cold((Mat<int> *)CONCAT44(in_n_rows,in_n_cols));
  return;
}

Assistant:

inline
Mat<eT>::Mat(const arma_vec_indicator&, const uword in_n_rows, const uword in_n_cols, const uhword in_vec_state)
  : n_rows(in_n_rows)
  , n_cols(in_n_cols)
  , n_elem(in_n_rows*in_n_cols)
  , n_alloc()
  , vec_state(in_vec_state)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  init_cold();
  }